

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgent.h
# Opt level: O2

ssize_t __thiscall
SyncEventAgent::send(SyncEventAgent *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char cVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *plVar2;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  RefCount::AddRef((RefCount *)this);
  cVar1 = (**(code **)(*plVar2 + 0x38))(plVar2);
  if (cVar1 == '\0') {
    (**(code **)*plVar2)(plVar2,this);
  }
  else {
    (*(this->super_EventAgent).super_Event.super_RefCount._vptr_RefCount[3])(this);
  }
  RefCount::Release((RefCount *)this);
  return extraout_RAX;
}

Assistant:

void send(IEventDispatcher *dispatcher)
	{
		// AddRef and Release calls are needed to provoke the
		// appropriate cleanup mechanisms for this SyncEventAgent
		// in the case that we do not send the event to the dispatcher.
		AddRef();
		
		if (dispatcher->isThreadCurrent())
		{
			deliver();
		}
		else
		{
			dispatcher->sendEventSync(this);
		}
		
		Release();
	}